

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter.cc
# Opt level: O2

Info * re2::Prefilter::Info::Alt(Info *a,Info *b)

{
  bool bVar1;
  Info *this;
  Prefilter *pPVar2;
  Prefilter *b_00;
  Info *pIVar3;
  
  this = (Info *)operator_new(0x40);
  Info(this);
  if ((a->is_exact_ == true) && (b->is_exact_ == true)) {
    pIVar3 = b;
    if ((a->exact_)._M_t._M_impl.super__Rb_tree_header._M_node_count <
        (b->exact_)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      pIVar3 = a;
      a = b;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_re2::Prefilter::LengthThenLex,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_re2::Prefilter::LengthThenLex,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this,(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_re2::Prefilter::LengthThenLex,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)a);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,re2::Prefilter::LengthThenLex,std::allocator<std::__cxx11::string>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,re2::Prefilter::LengthThenLex,std::allocator<std::__cxx11::string>>
                *)this,(pIVar3->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )&(pIVar3->exact_)._M_t._M_impl.super__Rb_tree_header);
    bVar1 = true;
    b = pIVar3;
  }
  else {
    pPVar2 = TakeMatch(a);
    b_00 = TakeMatch(b);
    pPVar2 = Or(pPVar2,b_00);
    this->match_ = pPVar2;
    bVar1 = false;
  }
  this->is_exact_ = bVar1;
  ~Info(a);
  operator_delete(a);
  if (b != (Info *)0x0) {
    ~Info(b);
  }
  operator_delete(b);
  return this;
}

Assistant:

Prefilter::Info* Prefilter::Info::Alt(Info* a, Info* b) {
  Info *ab = new Info();

  if (a->is_exact_ && b->is_exact_) {
    // Avoid string copies by moving the larger exact_ set into
    // ab directly, then merge in the smaller set.
    if (a->exact_.size() < b->exact_.size()) {
      using std::swap;
      swap(a, b);
    }
    ab->exact_ = std::move(a->exact_);
    ab->exact_.insert(b->exact_.begin(), b->exact_.end());
    ab->is_exact_ = true;
  } else {
    // Either a or b has is_exact_ = false. If the other
    // one has is_exact_ = true, we move it to match_ and
    // then create a OR of a,b. The resulting Info has
    // is_exact_ = false.
    ab->match_ = Prefilter::Or(a->TakeMatch(), b->TakeMatch());
    ab->is_exact_ = false;
  }

  delete a;
  delete b;
  return ab;
}